

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<int>(uint length,int value)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  int i;
  int *piVar4;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  int i_2;
  long lVar11;
  int *local_68;
  shared_ptr<int> pa;
  shared_ptr<int> pb;
  
  piVar4 = nosimd::common::malloc<int>(length + 1);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_68,piVar4,
             nosimd::common::free<int>);
  piVar4 = nosimd::common::malloc<int>(length + 1);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,piVar4,
             nosimd::common::free<int>);
  uVar3 = (ulong)length;
  local_68[uVar3] = 0x7f;
  *(undefined4 *)
   ((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar3 * 4) = 0x3f;
  iVar9 = (int)length >> 2;
  piVar4 = local_68;
  for (iVar10 = iVar9; 3 < iVar10; iVar10 = iVar10 + -4) {
    *piVar4 = value;
    piVar4[1] = value;
    piVar4[2] = value;
    piVar4[3] = value;
    piVar4[4] = value;
    piVar4[5] = value;
    piVar4[6] = value;
    piVar4[7] = value;
    piVar4[8] = value;
    piVar4[9] = value;
    piVar4[10] = value;
    piVar4[0xb] = value;
    piVar4[0xc] = value;
    piVar4[0xd] = value;
    piVar4[0xe] = value;
    piVar4[0xf] = value;
    piVar4 = piVar4 + 0x10;
  }
  if (1 < iVar10) {
    *piVar4 = value;
    piVar4[1] = value;
    piVar4[2] = value;
    piVar4[3] = value;
    piVar4[4] = value;
    piVar4[5] = value;
    piVar4[6] = value;
    piVar4[7] = value;
    iVar10 = iVar10 + -2;
    piVar4 = piVar4 + 8;
  }
  if (iVar10 != 0) {
    *piVar4 = value;
    piVar4[1] = value;
    piVar4[2] = value;
    piVar4[3] = value;
  }
  pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)length;
  lVar11 = (long)(int)(length & 0xfffffffc);
  for (lVar5 = lVar11;
      lVar5 < (long)pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      lVar5 = lVar5 + 1) {
    local_68[lVar5] = value;
  }
  uVar7 = 0;
  while (uVar3 != uVar7) {
    piVar4 = local_68 + uVar7;
    uVar7 = uVar7 + 1;
    if (*piVar4 != value) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar6 = "void test_common(unsigned int, T) [T = int]";
      *(undefined4 *)(puVar6 + 1) = 0x16;
      *(uint *)((long)puVar6 + 0xc) = length;
      __cxa_throw(puVar6,&Exception::typeinfo,0);
    }
  }
  lVar5 = 0;
  for (iVar10 = iVar9; 3 < iVar10; iVar10 = iVar10 + -4) {
    uVar2 = ((undefined8 *)((long)local_68 + lVar5))[1];
    puVar6 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base + lVar5);
    *puVar6 = *(undefined8 *)((long)local_68 + lVar5);
    puVar6[1] = uVar2;
    puVar6 = (undefined8 *)((long)local_68 + lVar5 + 0x10);
    uVar2 = puVar6[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                     _vptr__Sp_counted_base + lVar5);
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
    puVar6 = (undefined8 *)((long)local_68 + lVar5 + 0x20);
    uVar2 = puVar6[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base + lVar5);
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
    puVar6 = (undefined8 *)((long)local_68 + lVar5 + 0x30);
    uVar2 = puVar6[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
                     _vptr__Sp_counted_base + lVar5);
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
    lVar5 = lVar5 + 0x40;
  }
  if (iVar10 < 2) {
    puVar6 = (undefined8 *)(lVar5 + (long)local_68);
    puVar8 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base + lVar5);
  }
  else {
    puVar1 = (undefined8 *)(lVar5 + (long)local_68);
    puVar6 = puVar1 + 4;
    uVar2 = puVar1[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base + lVar5);
    puVar8[-4] = *puVar1;
    puVar8[-3] = uVar2;
    uVar2 = puVar1[3];
    puVar8[-2] = puVar1[2];
    puVar8[-1] = uVar2;
    iVar10 = iVar10 + -2;
  }
  lVar5 = lVar11;
  if (iVar10 != 0) {
    uVar2 = puVar6[1];
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
  }
  for (; lVar5 < (long)pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      lVar5 = lVar5 + 1) {
    *(int *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + lVar5 * 4) = local_68[lVar5];
  }
  uVar7 = 0;
  while (uVar3 != uVar7) {
    lVar5 = uVar7 * 4;
    uVar7 = uVar7 + 1;
    if (*(int *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                        _vptr__Sp_counted_base + lVar5) != value) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar6 = "void test_common(unsigned int, T) [T = int]";
      *(undefined4 *)(puVar6 + 1) = 0x1d;
      *(uint *)((long)puVar6 + 0xc) = length;
      __cxa_throw(puVar6,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<int>
            ((int *)pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,length)
  ;
  uVar7 = 0;
  while (uVar3 != uVar7) {
    lVar5 = uVar7 * 4;
    uVar7 = uVar7 + 1;
    if (*(int *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                        _vptr__Sp_counted_base + lVar5) != 0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar6 = "void test_common(unsigned int, T) [T = int]";
      *(undefined4 *)(puVar6 + 1) = 0x24;
      *(uint *)((long)puVar6 + 0xc) = length;
      __cxa_throw(puVar6,&Exception::typeinfo,0);
    }
  }
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    local_68[uVar7] = (int)uVar7;
  }
  lVar5 = 0;
  for (; 3 < iVar9; iVar9 = iVar9 + -4) {
    uVar2 = ((undefined8 *)((long)local_68 + lVar5))[1];
    puVar6 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base + lVar5);
    *puVar6 = *(undefined8 *)((long)local_68 + lVar5);
    puVar6[1] = uVar2;
    puVar6 = (undefined8 *)((long)local_68 + lVar5 + 0x10);
    uVar2 = puVar6[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                     _vptr__Sp_counted_base + lVar5);
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
    puVar6 = (undefined8 *)((long)local_68 + lVar5 + 0x20);
    uVar2 = puVar6[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base + lVar5);
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
    puVar6 = (undefined8 *)((long)local_68 + lVar5 + 0x30);
    uVar2 = puVar6[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
                     _vptr__Sp_counted_base + lVar5);
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
    lVar5 = lVar5 + 0x40;
  }
  if (iVar9 < 2) {
    puVar6 = (undefined8 *)(lVar5 + (long)local_68);
    puVar8 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base + lVar5);
  }
  else {
    puVar1 = (undefined8 *)(lVar5 + (long)local_68);
    puVar6 = puVar1 + 4;
    uVar2 = puVar1[1];
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base + lVar5);
    puVar8[-4] = *puVar1;
    puVar8[-3] = uVar2;
    uVar2 = puVar1[3];
    puVar8[-2] = puVar1[2];
    puVar8[-1] = uVar2;
    iVar9 = iVar9 + -2;
  }
  if (iVar9 != 0) {
    uVar2 = puVar6[1];
    *puVar8 = *puVar6;
    puVar8[1] = uVar2;
  }
  for (; lVar11 < (long)pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      lVar11 = lVar11 + 1) {
    *(int *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + lVar11 * 4) = local_68[lVar11];
  }
  uVar7 = 0xffffffffffffffff;
  while (uVar7 - uVar3 != -1) {
    lVar5 = uVar7 * 4;
    uVar7 = uVar7 + 1;
    if (uVar7 != *(uint *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar5 + 4)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar6 = "void test_common(unsigned int, T) [T = int]";
      *(undefined4 *)(puVar6 + 1) = 0x2d;
      *(uint *)((long)puVar6 + 0xc) = length;
      __cxa_throw(puVar6,&Exception::typeinfo,0);
    }
  }
  if ((local_68[uVar3] == 0x7f) &&
     (*(int *)((long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + uVar3 * 4) == 0x3f)) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar6 = "void test_common(unsigned int, T) [T = int]";
  *(undefined4 *)(puVar6 + 1) = 0x31;
  *(uint *)((long)puVar6 + 0xc) = length;
  __cxa_throw(puVar6,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}